

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O0

hrgls_Status hrgls_MessageCopy(hrgls_Message *returnMessage,hrgls_Message MessageToCopy)

{
  hrgls_Message_ *this;
  hrgls_Message ret;
  hrgls_Status s;
  hrgls_Message MessageToCopy_local;
  hrgls_Message *returnMessage_local;
  
  if (MessageToCopy == (hrgls_Message)0x0) {
    returnMessage_local._4_4_ = 0x3e9;
  }
  else {
    this = (hrgls_Message_ *)operator_new(0x38);
    hrgls_Message_::hrgls_Message_(this);
    hrgls_Message_::operator=(this,MessageToCopy);
    *returnMessage = this;
    returnMessage_local._4_4_ = 0;
  }
  return returnMessage_local._4_4_;
}

Assistant:

HRGLS_EXPORT hrgls_Status hrgls_MessageCopy(hrgls_Message *returnMessage, hrgls_Message MessageToCopy)
  {
          if (!MessageToCopy) {
            return hrgls_STATUS_BAD_PARAMETER;
          }

	  hrgls_Status s = hrgls_STATUS_OKAY;
	  hrgls_Message ret;
	  try {
		  ret = new hrgls_Message_;
	  } catch (...) {
		  s = hrgls_STATUS_OUT_OF_MEMORY;
		  ret = nullptr;
	  }

	  *ret = *MessageToCopy;

	  *returnMessage = ret;
	  return s;
  }